

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O1

void __thiscall r_exec::HLPBindingMap::init_from_f_ihlp(HLPBindingMap *this,_Fact *f_ihlp)

{
  short sVar1;
  pointer pPVar2;
  ObjectValue *pOVar3;
  AtomValue *pAVar4;
  StructureValue *pSVar5;
  atomic_int_fast64_t *paVar6;
  byte bVar7;
  char cVar8;
  undefined1 uVar9;
  ushort uVar10;
  uint16_t uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectValue *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  AtomValue *pAVar14;
  StructureValue *pSVar15;
  ulong uVar16;
  Atom atom;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  Code *local_40;
  ulong local_38;
  Code *source;
  
  local_40 = (Code *)f_ihlp;
  iVar12 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
             super_Code.super__Object._vptr__Object[9])(f_ihlp,0);
  source = (Code *)CONCAT44(extraout_var,iVar12);
  (*(source->super__Object)._vptr__Object[4])(source,2);
  uVar10 = r_code::Atom::asIndex();
  (*(source->super__Object)._vptr__Object[4])(source,(ulong)uVar10);
  bVar7 = r_code::Atom::getAtomCount();
  if (bVar7 != 0) {
    local_38 = (ulong)bVar7;
    local_48 = (ulong)(ushort)(uVar10 + 1);
    uVar16 = 0;
    do {
      iVar12 = (*(source->super__Object)._vptr__Object[4])
                         (source,(ulong)((int)local_48 + (int)uVar16 & 0xffff));
      local_54 = *(undefined4 *)CONCAT44(extraout_var_00,iVar12);
      cVar8 = r_code::Atom::getDescriptor();
      if (cVar8 == -0x7c) {
        pOVar13 = (ObjectValue *)operator_new(0x20);
        uVar11 = r_code::Atom::asIndex();
        StructureValue::StructureValue
                  ((StructureValue *)pOVar13,&this->super_BindingMap,source,uVar11);
LAB_0015a193:
        pPVar2 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar3 = (ObjectValue *)pPVar2[uVar16].object;
        if (pOVar3 != pOVar13) {
          if (pOVar3 != (ObjectValue *)0x0) {
            LOCK();
            paVar6 = &(pOVar3->super_BoundValue).super_Value.super__Object.refCount;
            (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pOVar3->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pOVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar2[uVar16].object = (_Object *)pOVar13;
          LOCK();
          paVar6 = &(pOVar13->super_BoundValue).super_Value.super__Object.refCount;
          (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
      }
      else {
        if (cVar8 == -0x7b) {
          pOVar13 = (ObjectValue *)operator_new(0x20);
          uVar10 = r_code::Atom::asIndex();
          iVar12 = (*(source->super__Object)._vptr__Object[9])(source,(ulong)uVar10);
          ObjectValue::ObjectValue
                    (pOVar13,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_01,iVar12));
          goto LAB_0015a193;
        }
        pAVar14 = (AtomValue *)operator_new(0x20);
        local_4c = local_54;
        AtomValue::AtomValue(pAVar14,&this->super_BindingMap,(Atom *)&local_4c);
        pPVar2 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar4 = (AtomValue *)pPVar2[uVar16].object;
        if (pAVar4 != pAVar14) {
          if (pAVar4 != (AtomValue *)0x0) {
            LOCK();
            paVar6 = &(pAVar4->super_BoundValue).super_Value.super__Object.refCount;
            (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pAVar4->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pAVar4->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar2[uVar16].object = (_Object *)pAVar14;
          LOCK();
          paVar6 = &(pAVar14->super_BoundValue).super_Value.super__Object.refCount;
          (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        r_code::Atom::~Atom((Atom *)&local_4c);
      }
      r_code::Atom::~Atom((Atom *)&local_54);
      uVar16 = uVar16 + 1;
    } while (local_38 != uVar16);
  }
  (*(source->super__Object)._vptr__Object[4])(source,3);
  iVar12 = r_code::Atom::asIndex();
  uVar16 = (ulong)(this->super_BindingMap).first_index;
  if (uVar16 < (ulong)((long)(this->super_BindingMap).map.
                             super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_BindingMap).map.
                             super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_48 = CONCAT44(local_48._4_4_,iVar12 + 1) & 0xffffffff0000ffff;
    do {
      uVar10 = (this->super_BindingMap).fwd_after_index;
      if ((0 < (short)uVar10 && uVar16 == uVar10) ||
         (uVar10 = (this->super_BindingMap).fwd_before_index, 0 < (short)uVar10 && uVar16 == uVar10)
         ) goto LAB_0015a3e6;
      iVar12 = (*(source->super__Object)._vptr__Object[4])(source,local_48 & 0xffffffff);
      local_54 = *(undefined4 *)CONCAT44(extraout_var_02,iVar12);
      uVar9 = r_code::Atom::getDescriptor();
      switch(uVar9) {
      case 0x82:
      case 0x83:
      case 0x86:
        break;
      case 0x84:
        pOVar13 = (ObjectValue *)operator_new(0x20);
        uVar11 = r_code::Atom::asIndex();
        StructureValue::StructureValue
                  ((StructureValue *)pOVar13,&this->super_BindingMap,source,uVar11);
        goto LAB_0015a347;
      case 0x85:
        pOVar13 = (ObjectValue *)operator_new(0x20);
        uVar10 = r_code::Atom::asIndex();
        iVar12 = (*(source->super__Object)._vptr__Object[9])(source,(ulong)uVar10);
        ObjectValue::ObjectValue
                  (pOVar13,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_03,iVar12));
LAB_0015a347:
        pPVar2 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar3 = (ObjectValue *)pPVar2[uVar16].object;
        if (pOVar3 != pOVar13) {
          if (pOVar3 != (ObjectValue *)0x0) {
            LOCK();
            paVar6 = &(pOVar3->super_BoundValue).super_Value.super__Object.refCount;
            (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pOVar3->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pOVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar2[uVar16].object = (_Object *)pOVar13;
          LOCK();
          paVar6 = &(pOVar13->super_BoundValue).super_Value.super__Object.refCount;
          (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        break;
      default:
        pAVar14 = (AtomValue *)operator_new(0x20);
        local_50 = local_54;
        AtomValue::AtomValue(pAVar14,&this->super_BindingMap,(Atom *)&local_50);
        pPVar2 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar4 = (AtomValue *)pPVar2[uVar16].object;
        if (pAVar4 != pAVar14) {
          if (pAVar4 != (AtomValue *)0x0) {
            LOCK();
            paVar6 = &(pAVar4->super_BoundValue).super_Value.super__Object.refCount;
            (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pAVar4->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pAVar4->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar2[uVar16].object = (_Object *)pAVar14;
          LOCK();
          paVar6 = &(pAVar14->super_BoundValue).super_Value.super__Object.refCount;
          (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        r_code::Atom::~Atom((Atom *)&local_50);
      }
      r_code::Atom::~Atom((Atom *)&local_54);
LAB_0015a3e6:
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)(this->super_BindingMap).map.
                                    super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->super_BindingMap).map.
                                    super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pSVar15 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar15,&this->super_BindingMap,local_40,2);
  sVar1 = (this->super_BindingMap).fwd_after_index;
  pPVar2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (StructureValue *)pPVar2[sVar1].object;
  if (pSVar5 != pSVar15) {
    if (pSVar5 != (StructureValue *)0x0) {
      LOCK();
      paVar6 = &(pSVar5->super_BoundValue).super_Value.super__Object.refCount;
      (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar5->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar5->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar2[sVar1].object = (_Object *)pSVar15;
    LOCK();
    paVar6 = &(pSVar15->super_BoundValue).super_Value.super__Object.refCount;
    (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  pSVar15 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar15,&this->super_BindingMap,local_40,3);
  sVar1 = (this->super_BindingMap).fwd_before_index;
  pPVar2 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (StructureValue *)pPVar2[sVar1].object;
  if (pSVar5 != pSVar15) {
    if (pSVar5 != (StructureValue *)0x0) {
      LOCK();
      paVar6 = &(pSVar5->super_BoundValue).super_Value.super__Object.refCount;
      (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar5->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar5->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar2[sVar1].object = (_Object *)pSVar15;
    LOCK();
    paVar6 = &(pSVar15->super_BoundValue).super_Value.super__Object.refCount;
    (paVar6->super___atomic_base<long>)._M_i = (paVar6->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void HLPBindingMap::init_from_f_ihlp(const _Fact *f_ihlp)   // source is f->icst or f->imdl; map already initialized with values from hlp.
{
    Code *ihlp = f_ihlp->get_reference(0);
    uint16_t tpl_val_set_index = ihlp->code(I_HLP_TPL_ARGS).asIndex();
    uint16_t tpl_val_count = ihlp->code(tpl_val_set_index++).getAtomCount();

    for (uint16_t i = 0; i < tpl_val_count; ++i) { // valuate tpl args.
        Atom atom = ihlp->code(tpl_val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[i] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[i] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        default:
            map[i] = new AtomValue(this, atom);
            break;
        }
    }

    uint16_t val_set_index = ihlp->code(I_HLP_ARGS).asIndex() + 1;
    uint64_t i = 0;

    for (uint64_t j = first_index; j < map.size(); ++j) { // valuate args.
        if ((fwd_after_index > 0 && j == uint64_t(fwd_after_index)) || (fwd_before_index > 0 && j == uint64_t(fwd_before_index))) {
            continue;
        }

        Atom atom = ihlp->code(val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[j] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[j] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        case Atom::WILDCARD:
        case Atom::T_WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            map[j] = new AtomValue(this, atom);
            break;
        }
    }

    map[fwd_after_index] = new StructureValue(this, f_ihlp, FACT_AFTER); // valuate timings; fwd_after_index is already known.
    map[fwd_before_index] = new StructureValue(this, f_ihlp, FACT_BEFORE);
}